

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void ssl_buffering_free_slot(mbedtls_ssl_context *ssl,uint8_t slot)

{
  mbedtls_ssl_transform *len;
  ulong uVar1;
  undefined7 in_register_00000031;
  
  if (slot < 4) {
    uVar1 = CONCAT71(in_register_00000031,slot) & 0xffffffff;
    if (((ulong)(&ssl[2].handshake)[uVar1 * 3] & 1) != 0) {
      len = (&ssl[2].transform_out)[uVar1 * 3];
      ssl[2].session = (mbedtls_ssl_session *)((long)ssl[2].session - (long)len);
      mbedtls_zeroize_and_free((&ssl[2].transform_in)[uVar1 * 3],(size_t)len);
      (&ssl[2].handshake)[uVar1 * 3] = (mbedtls_ssl_handshake_params *)0x0;
      (&ssl[2].transform_in)[uVar1 * 3] = (mbedtls_ssl_transform *)0x0;
      (&ssl[2].transform_out)[uVar1 * 3] = (mbedtls_ssl_transform *)0x0;
    }
  }
  return;
}

Assistant:

static void ssl_buffering_free_slot(mbedtls_ssl_context *ssl,
                                    uint8_t slot)
{
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    mbedtls_ssl_hs_buffer * const hs_buf = &hs->buffering.hs[slot];

    if (slot >= MBEDTLS_SSL_MAX_BUFFERED_HS) {
        return;
    }

    if (hs_buf->is_valid == 1) {
        hs->buffering.total_bytes_buffered -= hs_buf->data_len;
        mbedtls_zeroize_and_free(hs_buf->data, hs_buf->data_len);
        memset(hs_buf, 0, sizeof(mbedtls_ssl_hs_buffer));
    }
}